

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O1

bool __thiscall
iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianF
          (AttitudeQuaternionEKF *this,VectorDynSize *x,MatrixDynSize *F)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  size_t sVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong *puVar10;
  undefined4 *puVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  Index index;
  ulong uVar17;
  char *pcVar18;
  Matrix3x3 *pMVar19;
  ulong uVar20;
  double *pdVar21;
  PointerType ptr;
  undefined8 *puVar22;
  byte bVar23;
  uint uVar24;
  double dVar25;
  MatrixDynSize dfq_by_dangvel;
  Matrix4x4 dfq_by_dq;
  Matrix3x3 dfgyrobias_by_dgyrobias;
  Matrix3x3 dfangvel_by_dgyrobias;
  MatrixDynSize local_1b0 [40];
  undefined1 local_188 [16];
  undefined4 local_178;
  uint uStack_174;
  undefined4 uStack_170;
  uint uStack_16c;
  undefined1 local_168 [16];
  undefined4 local_158;
  uint uStack_154;
  ulong uStack_150;
  undefined1 local_148 [8];
  undefined8 uStack_140;
  undefined1 auStack_138 [8];
  undefined8 uStack_130;
  undefined1 auStack_128 [16];
  undefined1 local_118 [16];
  undefined1 auStack_108 [12];
  uint uStack_fc;
  undefined1 local_f8 [12];
  uint uStack_ec;
  undefined1 local_e8 [16];
  undefined1 auStack_d8 [16];
  undefined1 local_c8 [16];
  double local_b8 [4];
  double local_98;
  double dStack_90;
  undefined1 local_88 [16];
  double local_78 [2];
  uint uStack_64;
  uint uStack_5c;
  uint uStack_54;
  uint uStack_4c;
  uint uStack_44;
  uint uStack_3c;
  uint uStack_34;
  uint uStack_2c;
  ulong local_28;
  
  bVar23 = 0;
  sVar7 = iDynTree::VectorDynSize::size();
  if (sVar7 == this->m_state_size) {
    sVar7 = iDynTree::MatrixDynSize::rows();
    if ((sVar7 == this->m_state_size) &&
       (sVar7 = iDynTree::MatrixDynSize::cols(), sVar7 == this->m_state_size)) {
      iDynTree::MatrixDynSize::zero();
      puVar8 = (undefined8 *)iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      local_178 = (undefined4)*puVar8;
      uStack_174 = (uint)((ulong)*puVar8 >> 0x20);
      uStack_170 = (undefined4)puVar8[1];
      uStack_16c = (uint)((ulong)puVar8[1] >> 0x20);
      uStack_150 = puVar8[3];
      local_158 = (undefined4)puVar8[2];
      uStack_154 = (uint)((ulong)puVar8[2] >> 0x20);
      lVar9 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      local_168 = *(undefined1 (*) [16])(lVar9 + 0x20);
      local_188._8_8_ = 0;
      local_188._0_8_ = *(ulong *)(lVar9 + 0x30);
      iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      dVar25 = (this->m_params_qekf).time_step_in_seconds;
      dVar3 = 2.0 / dVar25;
      local_f8._8_4_ = local_168._0_4_;
      local_f8._0_8_ = dVar3;
      uStack_ec = local_168._4_4_;
      auStack_d8._0_8_ = -local_168._0_8_;
      local_118._0_8_ = local_188._0_8_;
      uStack_140._0_4_ = local_168._0_4_;
      local_148 = (undefined1  [8])dVar3;
      uStack_140._4_4_ = local_168._4_4_ ^ 0x80000000;
      auStack_138._4_4_ = (int)((ulong)-(double)local_168._8_8_ >> 0x20);
      auStack_138._0_4_ = local_168._8_4_;
      auStack_108._8_4_ = local_188._0_4_;
      auStack_108._0_8_ = local_168._8_8_;
      uStack_fc = local_188._4_4_ ^ 0x80000000;
      uStack_130._0_4_ = local_188._0_4_;
      uStack_130._4_4_ = local_188._4_4_ ^ 0x80000000;
      dVar25 = dVar25 * 0.5;
      dVar4 = uStack_140 * dVar25;
      uStack_140._0_4_ = SUB84(dVar4,0);
      local_148 = (undefined1  [8])(dVar3 * dVar25);
      uStack_140._4_4_ = (int)((ulong)dVar4 >> 0x20);
      dVar4 = uStack_130 * dVar25;
      uStack_130._0_4_ = SUB84(dVar4,0);
      auStack_138 = (undefined1  [8])((double)auStack_138 * dVar25);
      uStack_130._4_4_ = (int)((ulong)dVar4 >> 0x20);
      auStack_128._8_4_ = SUB84(dVar3 * dVar25,0);
      auStack_128._0_8_ = local_168._0_8_ * dVar25;
      auStack_128._12_4_ = (int)((ulong)(dVar3 * dVar25) >> 0x20);
      dVar4 = -(double)local_168._8_8_ * dVar25;
      auVar1._8_4_ = SUB84(dVar4,0);
      auVar1._0_8_ = (double)local_118._0_8_ * dVar25;
      auVar1._12_4_ = (int)((ulong)dVar4 >> 0x20);
      dVar4 = stack0xffffffffffffff00 * dVar25;
      auStack_108._8_4_ = SUB84(dVar4,0);
      auStack_108._0_8_ = (double)local_168._8_8_ * dVar25;
      uStack_fc = (int)((ulong)dVar4 >> 0x20);
      dVar4 = stack0xffffffffffffff10 * dVar25;
      local_f8._8_4_ = SUB84(dVar4,0);
      local_f8._0_8_ = dVar3 * dVar25;
      uStack_ec = (int)((ulong)dVar4 >> 0x20);
      local_e8._8_4_ = SUB84((double)local_168._8_8_ * dVar25,0);
      local_e8._0_8_ = (double)local_118._0_8_ * dVar25;
      local_e8._12_4_ = (int)((ulong)((double)local_168._8_8_ * dVar25) >> 0x20);
      auStack_d8._8_4_ = SUB84(dVar25 * dVar3,0);
      auStack_d8._0_8_ = dVar25 * (double)auStack_d8._0_8_;
      auStack_d8._12_4_ = (int)((ulong)(dVar25 * dVar3) >> 0x20);
      local_118 = auVar1;
      iDynTree::MatrixDynSize::MatrixDynSize(local_1b0);
      iDynTree::MatrixDynSize::resize((ulong)local_1b0,4);
      puVar10 = (ulong *)iDynTree::MatrixDynSize::operator()((ulong)local_1b0,2);
      auVar6._4_4_ = uStack_174;
      auVar6._0_4_ = local_178;
      auVar6._8_4_ = uStack_170;
      auVar6._12_4_ = uStack_16c;
      local_168._8_4_ = uStack_170;
      local_168._0_8_ = auVar6._8_8_;
      local_168._12_4_ = uStack_16c;
      uVar17 = auVar6._8_8_ ^ 0x8000000000000000;
      local_188._8_4_ = uStack_170;
      local_188._0_8_ = uVar17;
      local_188._12_4_ = uStack_16c ^ 0x80000000;
      *puVar10 = uVar17;
      puVar8 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_1b0,0);
      *puVar8 = local_188._0_8_;
      puVar11 = (undefined4 *)iDynTree::MatrixDynSize::operator()((ulong)local_1b0,3);
      local_188._0_8_ = CONCAT44(uStack_154,local_158) ^ 0x8000000000000000;
      local_188._8_4_ = (int)uStack_150;
      local_188._12_4_ = (uint)(uStack_150 >> 0x20) ^ 0x80000000;
      *puVar11 = local_158;
      puVar11[1] = uStack_154 ^ 0x80000000;
      puVar8 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_1b0,0);
      *puVar8 = local_188._0_8_;
      puVar10 = (ulong *)iDynTree::MatrixDynSize::operator()((ulong)local_1b0,1);
      uVar24 = (uint)(uStack_150 >> 0x20);
      local_c8._8_4_ = (int)uStack_150;
      local_c8._0_8_ = uStack_150;
      local_c8._12_4_ = uVar24;
      local_188._8_4_ = (int)uStack_150;
      local_188._0_8_ = uStack_150 ^ 0x8000000000000000;
      local_188._12_4_ = uVar24 ^ 0x80000000;
      *puVar10 = uStack_150 ^ 0x8000000000000000;
      puVar8 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_1b0,0);
      *puVar8 = local_188._0_8_;
      puVar8 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_1b0,2);
      *puVar8 = local_c8._0_8_;
      puVar8 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_1b0,1);
      *puVar8 = CONCAT44(uStack_154,local_158);
      puVar8 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_1b0,3);
      *puVar8 = local_168._0_8_;
      puVar11 = (undefined4 *)iDynTree::MatrixDynSize::operator()((ulong)local_1b0,3);
      uStack_174 = uStack_174 ^ 0x80000000;
      uStack_16c = uStack_16c ^ 0x80000000;
      *puVar11 = local_178;
      puVar11[1] = uStack_174;
      puVar8 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_1b0,2);
      *puVar8 = CONCAT44(uStack_174,local_178);
      puVar8 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_1b0,1);
      *puVar8 = CONCAT44(uStack_174,local_178);
      dVar25 = (this->m_params_qekf).time_step_in_seconds;
      local_178 = SUB84(dVar25,0);
      uStack_174 = (uint)((ulong)dVar25 >> 0x20);
      uStack_170 = 0;
      uStack_16c = 0;
      uVar12 = iDynTree::MatrixDynSize::data();
      lVar9 = iDynTree::MatrixDynSize::rows();
      lVar13 = iDynTree::MatrixDynSize::cols();
      uVar14 = lVar13 * lVar9;
      uVar17 = uVar14;
      if (((uVar12 & 7) == 0) &&
         (uVar17 = (ulong)((uint)(uVar12 >> 3) & 1), (long)uVar14 <= (long)uVar17)) {
        uVar17 = uVar14;
      }
      dVar25 = (double)CONCAT44(uStack_174,local_178) * 0.5;
      lVar9 = uVar14 - uVar17;
      if (0 < (long)uVar17) {
        uVar20 = 0;
        do {
          *(double *)(uVar12 + uVar20 * 8) = *(double *)(uVar12 + uVar20 * 8) * dVar25;
          uVar20 = uVar20 + 1;
        } while (uVar17 != uVar20);
      }
      lVar13 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
      if (1 < lVar9) {
        do {
          pdVar21 = (double *)(uVar12 + uVar17 * 8);
          dVar3 = pdVar21[1] * dVar25;
          auVar2._8_4_ = SUB84(dVar3,0);
          auVar2._0_8_ = *pdVar21 * dVar25;
          auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
          *(undefined1 (*) [16])(uVar12 + uVar17 * 8) = auVar2;
          uVar17 = uVar17 + 2;
        } while ((long)uVar17 < lVar13);
      }
      if (lVar13 < (long)uVar14) {
        do {
          *(double *)(uVar12 + lVar13 * 8) = *(double *)(uVar12 + lVar13 * 8) * dVar25;
          lVar13 = lVar13 + 1;
        } while (uVar14 - lVar13 != 0);
      }
      pMVar19 = &this->m_Id3;
      pdVar21 = (double *)&stack0xffffffffffffff98;
      for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
        *pdVar21 = pMVar19->m_data[0];
        pMVar19 = (Matrix3x3 *)((long)pMVar19 + (ulong)bVar23 * -0x10 + 8);
        pdVar21 = pdVar21 + (ulong)bVar23 * -2 + 1;
      }
      uStack_64 = uStack_64 ^ 0x80000000;
      uStack_5c = uStack_5c ^ 0x80000000;
      uStack_54 = uStack_54 ^ 0x80000000;
      uStack_4c = uStack_4c ^ 0x80000000;
      uStack_44 = uStack_44 ^ 0x80000000;
      uStack_3c = uStack_3c ^ 0x80000000;
      uStack_34 = uStack_34 ^ 0x80000000;
      uStack_2c = uStack_2c ^ 0x80000000;
      local_28 = local_28 ^ 0x8000000000000000;
      pMVar19 = &this->m_Id3;
      pdVar21 = local_b8;
      for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
        *pdVar21 = pMVar19->m_data[0];
        pMVar19 = (Matrix3x3 *)((long)pMVar19 + (ulong)bVar23 * -0x10 + 8);
        pdVar21 = pdVar21 + (ulong)bVar23 * -2 + 1;
      }
      dVar3 = 1.0 - (this->m_params_qekf).bias_correlation_time_factor *
                    (this->m_params_qekf).time_step_in_seconds;
      local_b8[0] = local_b8[0] * dVar3;
      local_b8[1] = local_b8[1] * dVar3;
      local_b8[2] = local_b8[2] * dVar3;
      local_b8[3] = local_b8[3] * dVar3;
      local_98 = local_98 * dVar3;
      dStack_90 = dStack_90 * dVar3;
      dVar25 = dVar3 * (double)local_88._8_8_;
      local_88._8_4_ = SUB84(dVar25,0);
      local_88._0_8_ = dVar3 * (double)local_88._0_8_;
      local_88._12_4_ = (int)((ulong)dVar25 >> 0x20);
      local_78[0] = dVar3 * local_78[0];
      lVar9 = iDynTree::MatrixDynSize::data();
      iDynTree::MatrixDynSize::rows();
      lVar13 = iDynTree::MatrixDynSize::cols();
      puVar8 = (undefined8 *)(lVar9 + 0x10);
      lVar9 = 0x10;
      do {
        uVar5 = *(undefined8 *)(local_148 + lVar9 + -8);
        puVar8[-2] = *(undefined8 *)((long)&local_158 + lVar9);
        puVar8[-1] = uVar5;
        uVar5 = *(undefined8 *)(local_148 + lVar9 + 8);
        *puVar8 = *(undefined8 *)(local_148 + lVar9);
        puVar8[1] = uVar5;
        lVar9 = lVar9 + 0x20;
        puVar8 = puVar8 + lVar13;
      } while (lVar9 != 0x90);
      lVar9 = iDynTree::MatrixDynSize::data();
      iDynTree::MatrixDynSize::rows();
      lVar13 = iDynTree::MatrixDynSize::cols();
      lVar15 = iDynTree::MatrixDynSize::data();
      iDynTree::MatrixDynSize::rows();
      lVar16 = iDynTree::MatrixDynSize::cols();
      puVar8 = (undefined8 *)(lVar15 + 0x30);
      puVar22 = (undefined8 *)(lVar9 + 0x10);
      lVar9 = 4;
      do {
        uVar5 = puVar22[-1];
        puVar8[-2] = puVar22[-2];
        puVar8[-1] = uVar5;
        *puVar8 = *puVar22;
        puVar22 = puVar22 + lVar13;
        puVar8 = puVar8 + lVar16;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
      lVar9 = iDynTree::MatrixDynSize::data();
      iDynTree::MatrixDynSize::rows();
      lVar13 = iDynTree::MatrixDynSize::cols();
      puVar8 = (undefined8 *)(lVar13 * 0x20 + lVar9 + 0x48);
      lVar9 = 0x10;
      do {
        uVar5 = *(undefined8 *)((long)local_78 + lVar9 + 8);
        puVar8[-2] = *(undefined8 *)((long)local_78 + lVar9);
        puVar8[-1] = uVar5;
        *puVar8 = *(undefined8 *)(&stack0xffffffffffffff98 + lVar9);
        lVar9 = lVar9 + 0x18;
        puVar8 = puVar8 + lVar13;
      } while (lVar9 != 0x58);
      lVar9 = iDynTree::MatrixDynSize::data();
      iDynTree::MatrixDynSize::rows();
      lVar13 = iDynTree::MatrixDynSize::cols();
      puVar8 = (undefined8 *)(lVar13 * 0x38 + lVar9 + 0x48);
      lVar9 = 0x10;
      do {
        uVar5 = *(undefined8 *)(local_c8 + lVar9 + 8);
        puVar8[-2] = *(undefined8 *)(local_c8 + lVar9);
        puVar8[-1] = uVar5;
        *puVar8 = *(undefined8 *)((long)local_b8 + lVar9);
        lVar9 = lVar9 + 0x18;
        puVar8 = puVar8 + lVar13;
      } while (lVar9 != 0x58);
      iDynTree::MatrixDynSize::~MatrixDynSize(local_1b0);
      return true;
    }
    pcVar18 = "jacobian matrix size mismatch";
  }
  else {
    pcVar18 = "state size mismatch";
  }
  iDynTree::reportError("AttitudeQuaternionEKF","computejacobianF",pcVar18);
  return false;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianF(iDynTree::VectorDynSize& x, iDynTree::MatrixDynSize& F)
{
    using iDynTree::toEigen;

    if (x.size() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianF", "state size mismatch");
        return false;
    }

    if (F.rows() != m_state_size || F.cols() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianF", "jacobian matrix size mismatch");
        return false;
    }

    F.zero();

    iDynTree::UnitQuaternion q;
    iDynTree::Vector3 ang_vel, gyro_bias;
    toEigen(q) = toEigen(x).block<4,1>(0, 0);
    toEigen(ang_vel) = toEigen(x).block<3,1>(4, 0);
    toEigen(gyro_bias) = toEigen(x).block<3,1>(7, 0);

    iDynTree::Matrix4x4 dfq_by_dq;
    dfq_by_dq(0,0) = dfq_by_dq(1, 1) = dfq_by_dq(2, 2) = dfq_by_dq(3, 3) = (2.0/m_params_qekf.time_step_in_seconds);
    dfq_by_dq(1, 0) = dfq_by_dq(2, 3) = ang_vel(0);
    dfq_by_dq(2, 0) = dfq_by_dq(3, 1) = ang_vel(1);
    dfq_by_dq(3, 0) = dfq_by_dq(1, 2) = ang_vel(2);
    dfq_by_dq(0, 1) = dfq_by_dq(3, 2) = -ang_vel(0);
    dfq_by_dq(0, 2) = dfq_by_dq(1, 3) = -ang_vel(1);
    dfq_by_dq(0, 3) = dfq_by_dq(2, 1) = -ang_vel(2);
    toEigen(dfq_by_dq) *= (m_params_qekf.time_step_in_seconds/2.0);

    iDynTree::MatrixDynSize dfq_by_dangvel;
    dfq_by_dangvel.resize(4, 3);
    dfq_by_dangvel(0, 0) = dfq_by_dangvel(2, 2) = -q(1);
    dfq_by_dangvel(0, 1) = dfq_by_dangvel(3, 0) = -q(2);
    dfq_by_dangvel(0, 2) = dfq_by_dangvel(1, 1) = -q(3);
    dfq_by_dangvel(2, 0) = q(3);
    dfq_by_dangvel(1, 2) = q(2);
    dfq_by_dangvel(3, 1) = q(1);
    dfq_by_dangvel(1, 0) = dfq_by_dangvel(2, 1) = dfq_by_dangvel(3, 2) = -q(0);
    toEigen(dfq_by_dangvel) *= (m_params_qekf.time_step_in_seconds/2.0);

    iDynTree::Matrix3x3 dfangvel_by_dgyrobias(m_Id3);
    toEigen(dfangvel_by_dgyrobias) *= -1;

    iDynTree::Matrix3x3 dfgyrobias_by_dgyrobias(m_Id3);
    toEigen(dfgyrobias_by_dgyrobias) *= (1 - (m_params_qekf.bias_correlation_time_factor*m_params_qekf.time_step_in_seconds));

    toEigen(F).block<4,4>(0,0) = toEigen(dfq_by_dq);
    toEigen(F).block<4,3>(0,4) = toEigen(dfq_by_dangvel);
    toEigen(F).block<3,3>(4,7) = toEigen(dfangvel_by_dgyrobias);
    toEigen(F).block<3,3>(7,7) = toEigen(dfgyrobias_by_dgyrobias);

    return true;
}